

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void __thiscall
cppcms::util::urlencode_impl<std::ostreambuf_iterator<char,std::char_traits<char>>>
          (util *this,char *b,char *e,ostreambuf_iterator<char,_std::char_traits<char>_> out)

{
  util uVar1;
  uint uVar2;
  int iVar3;
  ulong extraout_RAX;
  uint uVar4;
  
  if (this != (util *)b) {
    uVar4 = (uint)out._M_sbuf;
    do {
      uVar1 = *this;
      uVar2 = uVar4;
      if (((((byte)((char)uVar1 - 0x30U) < 10) || ((byte)(((byte)uVar1 & 0xdf) + 0xbf) < 0x1a)) ||
          ((byte)uVar1 - 0x2d < 2)) || ((uVar1 == (util)0x7e || (uVar1 == (util)0x5f)))) {
        if ((uVar4 & 1) == 0) {
          if (*(util **)(e + 0x28) < *(util **)(e + 0x30)) {
            **(util **)(e + 0x28) = uVar1;
            goto LAB_001e3d44;
          }
          iVar3 = (**(code **)(*(long *)e + 0x68))(e,(uint)(byte)uVar1);
          uVar2 = uVar4 & 0xff;
          if (iVar3 == -1) {
            uVar2 = 1;
          }
        }
      }
      else if ((uVar4 & 1) == 0) {
        if (*(undefined1 **)(e + 0x28) < *(undefined1 **)(e + 0x30)) {
          **(undefined1 **)(e + 0x28) = 0x25;
          *(long *)(e + 0x28) = *(long *)(e + 0x28) + 1;
        }
        else {
          urlencode_impl<std::ostreambuf_iterator<char,std::char_traits<char>>>((util *)e);
          uVar2 = 1;
          if ((extraout_RAX & 1) != 0) goto LAB_001e3d4a;
        }
        if (*(char **)(e + 0x28) < *(char **)(e + 0x30)) {
          **(char **)(e + 0x28) = "0123456789abcdef"[(byte)uVar1 >> 4];
          *(long *)(e + 0x28) = *(long *)(e + 0x28) + 1;
        }
        else {
          iVar3 = (**(code **)(*(long *)e + 0x68))(e,"0123456789abcdef"[(byte)uVar1 >> 4]);
          if (iVar3 == -1) {
            uVar2 = 1;
            goto LAB_001e3d4a;
          }
        }
        if (*(char **)(e + 0x28) < *(char **)(e + 0x30)) {
          **(char **)(e + 0x28) = "0123456789abcdef"[(byte)uVar1 & 0xf];
LAB_001e3d44:
          *(long *)(e + 0x28) = *(long *)(e + 0x28) + 1;
          uVar2 = uVar4;
        }
        else {
          iVar3 = (**(code **)(*(long *)e + 0x68))(e,"0123456789abcdef"[(byte)uVar1 & 0xf]);
          uVar2 = 1;
          if (iVar3 != -1) {
            uVar2 = uVar4 & 0xff;
          }
        }
      }
LAB_001e3d4a:
      uVar4 = uVar2;
      this = this + 1;
    } while (this != (util *)b);
  }
  return;
}

Assistant:

void urlencode_impl(char const *b,char const *e,Iterator out)
{
	while(b!=e){
		char c=*b++;
		if(	('a'<=c && c<='z')
			|| ('A'<=c && c<='Z')
			|| ('0'<=c && c<='9'))
		{
			*out++ = c;
		}
		else {
			switch(c) {
				case '-':
				case '_':
				case '.':
				case '~':
					*out++ = c;
					break;
				default:
				{
					static char const hex[]="0123456789abcdef";
					unsigned char uc = c;
					*out++ = '%';
					*out++ = hex[(uc >> 4) & 0xF];
					*out++ = hex[ uc & 0xF];
					
				}
			};
		}
	};
}